

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O0

void load_frames(char *fn,int start,int n_frame,int x,int y,qnode_ptr_t cub,int bin)

{
  int local_ec;
  char local_e8 [4];
  int i;
  string s2;
  string s1;
  uchar hd [32];
  qnode_ptr_t cub_local;
  int y_local;
  int x_local;
  int n_frame_local;
  int start_local;
  char *fn_local;
  
  x_local = start;
  for (local_ec = 0; local_ec < n_frame; local_ec = local_ec + 1) {
    sprintf(s2 + 0x48,"%d",(ulong)(uint)x_local);
    concat(fn,s2 + 0x48,local_e8);
    if (bin == 0) {
      pgetrast(local_e8,(uchar *)(s1 + 0x48),*cub->gauss_ptr[local_ec],x,y,0x13c);
    }
    else {
      Bpgetrast(local_e8,*cub->gauss_ptr[local_ec],x,y,0x13c);
    }
    x_local = x_local + 1;
  }
  return;
}

Assistant:

void load_frames(fn,start,n_frame,x,y,cub,bin)
string fn ;
int start, n_frame, x, y, bin ;
qnode_ptr_t cub ;

{ unsigned char hd[H] ;
  string s1, s2 ;
  int i ;

  for (i = 0 ; i < n_frame ; i++) {
    sprintf(s1,"%d",start);
    concat(fn,s1,s2) ;
    if (!bin) {
      pgetrast(s2,hd,cub->gauss_ptr[i],x,y,X) ;
    }
    else {
      Bpgetrast(s2,cub->gauss_ptr[i],x,y,X) ;
    }
    start++ ;
  }
}